

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::Texture1D::updateView(Texture1D *this,DepthStencilMode mode)

{
  bool bVar1;
  int iVar2;
  int y;
  ConstPixelBufferAccess *pCVar3;
  Sampler *pSVar4;
  int local_54;
  Texture2DView local_48;
  Texture2DView local_38;
  int local_24;
  undefined1 local_1d;
  int numLevels;
  int iStack_18;
  bool isMipmap;
  int width;
  int baseLevel;
  DepthStencilMode mode_local;
  Texture1D *this_local;
  
  width = mode;
  _baseLevel = this;
  iStack_18 = Texture::getBaseLevel(&this->super_Texture);
  bVar1 = hasLevel(this,iStack_18);
  if (bVar1) {
    pCVar3 = &getLevel(this,iStack_18)->super_ConstPixelBufferAccess;
    bVar1 = isEmpty(pCVar3);
    if (!bVar1) {
      pCVar3 = &getLevel(this,iStack_18)->super_ConstPixelBufferAccess;
      numLevels = tcu::ConstPixelBufferAccess::getWidth(pCVar3);
      pSVar4 = Texture::getSampler(&this->super_Texture);
      local_1d = isMipmapFilter(pSVar4->minFilter);
      if ((bool)local_1d) {
        iVar2 = Texture::getMaxLevel(&this->super_Texture);
        iVar2 = iVar2 - iStack_18;
        y = getNumMipLevels1D(numLevels);
        local_54 = de::min<int>(iVar2 + 1,y);
      }
      else {
        local_54 = 1;
      }
      local_24 = local_54;
      TextureLevelArray::updateSamplerMode(&this->m_levels,width);
      iVar2 = local_24;
      pCVar3 = TextureLevelArray::getEffectiveLevels(&this->m_levels);
      tcu::Texture2DView::Texture2DView(&local_38,iVar2,pCVar3 + iStack_18);
      (this->m_view).m_numLevels = local_38.m_numLevels;
      *(undefined4 *)&(this->m_view).field_0x4 = local_38._4_4_;
      (this->m_view).m_levels = local_38.m_levels;
      return;
    }
  }
  tcu::Texture2DView::Texture2DView(&local_48,0,(ConstPixelBufferAccess *)0x0);
  (this->m_view).m_numLevels = local_48.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_48._4_4_;
  (this->m_view).m_levels = local_48.m_levels;
  return;
}

Assistant:

void Texture1D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels1D(width)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture2DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture2DView(0, DE_NULL);
}